

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  size_t _elemsize;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  pointer pMVar11;
  int iVar12;
  void *pvVar13;
  long lVar14;
  void *__src;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  ulong local_a8;
  int local_a0;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  pvVar5 = (this->slices).data;
  if (uVar8 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar9 != 0) {
      iVar2 = pMVar4->w;
      uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
      lVar14 = 0;
      lVar9 = 0;
      iVar16 = 0;
      uVar15 = 0;
      do {
        iVar6 = *(int *)((long)pvVar5 + uVar15 * 4);
        if (iVar6 == -0xe9) {
          iVar6 = (int)((ulong)((long)iVar2 - (long)iVar16) / (uVar10 + lVar9));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar14),iVar6,_elemsize,opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar11->data + lVar14);
        if (pvVar13 == (void *)0x0) {
          bVar17 = true;
        }
        else {
          bVar17 = (long)*(int *)((long)&pMVar11->c + lVar14) *
                   *(long *)((long)&pMVar11->cstep + lVar14) == 0;
        }
        if (bVar17) {
          return -100;
        }
        memcpy(pvVar13,(void *)((long)iVar16 * 4 + (long)pMVar4->data),(long)iVar6 * _elemsize);
        iVar16 = iVar6 + iVar16;
        uVar15 = uVar15 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 0x6db6db6db6db6db7;
        lVar9 = lVar9 + -1;
        lVar14 = lVar14 + 0x38;
      } while (uVar15 < uVar10);
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar8 ^ 2) == 0 && uVar3 == 0) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar2 = pMVar4->w;
        iVar16 = pMVar4->h;
        uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
        lVar14 = 0;
        lVar9 = 0;
        local_a0 = 0;
        uVar15 = 0;
        do {
          iVar6 = *(int *)((long)pvVar5 + uVar15 * 4);
          if (iVar6 == -0xe9) {
            iVar6 = (int)((ulong)((long)iVar16 - (long)local_a0) / (uVar10 + lVar9));
          }
          Mat::create((Mat *)((long)&pMVar11->data + lVar14),iVar2,iVar6,_elemsize,
                      opt->blob_allocator);
          pvVar13 = *(void **)((long)&pMVar11->data + lVar14);
          if (pvVar13 == (void *)0x0) {
            bVar17 = true;
          }
          else {
            bVar17 = (long)*(int *)((long)&pMVar11->c + lVar14) *
                     *(long *)((long)&pMVar11->cstep + lVar14) == 0;
          }
          if (bVar17) {
            return -100;
          }
          memcpy(pvVar13,(void *)((long)pMVar4->w * (long)local_a0 * 4 + (long)pMVar4->data),
                 (long)(iVar6 * iVar2) * _elemsize);
          local_a0 = local_a0 + iVar6;
          uVar15 = uVar15 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   0x6db6db6db6db6db7;
          lVar9 = lVar9 + -1;
          lVar14 = lVar14 + 0x38;
        } while (uVar15 < uVar10);
      }
    }
    else {
      if ((uVar8 ^ 2) != 0 || (uVar3 ^ 1) != 0) {
        uVar8 = uVar8 ^ 3;
        if (uVar8 == 0 && uVar3 == 0) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          iVar16 = pMVar4->h;
          iVar6 = pMVar4->c;
          uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
          lVar14 = 0;
          lVar9 = 0;
          local_a8._0_4_ = 0;
          uVar15 = 0;
          while( true ) {
            iVar7 = *(int *)((long)pvVar5 + uVar15 * 4);
            if (iVar7 == -0xe9) {
              iVar7 = (int)((ulong)((long)iVar6 - (long)(int)local_a8) / (uVar10 + lVar9));
            }
            pMVar1 = (Mat *)((long)&pMVar11->data + lVar14);
            Mat::create(pMVar1,iVar2,iVar16,iVar7,_elemsize,opt->blob_allocator);
            if (*(long *)((long)&pMVar11->data + lVar14) == 0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)*(int *)((long)&pMVar11->c + lVar14) *
                       *(long *)((long)&pMVar11->cstep + lVar14) == 0;
            }
            if (bVar17) break;
            memcpy(pMVar1->data,
                   (void *)((long)(int)local_a8 * pMVar4->cstep * pMVar4->elemsize +
                           (long)pMVar4->data),(long)(iVar7 * (int)pMVar4->cstep) * _elemsize);
            local_a8._0_4_ = iVar7 + (int)local_a8;
            uVar15 = uVar15 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     0x6db6db6db6db6db7;
            lVar9 = lVar9 + -1;
            lVar14 = lVar14 + 0x38;
            if (uVar10 <= uVar15) {
              return 0;
            }
          }
        }
        else if ((uVar3 ^ 1) == 0 && uVar8 == 0) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar16 = pMVar4->w;
          uVar8 = pMVar4->c;
          iVar6 = pMVar4->h;
          uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
          uVar15 = 0;
          iVar2 = 0;
          while( true ) {
            iVar7 = *(int *)((long)pvVar5 + uVar15 * 4);
            if (iVar7 == -0xe9) {
              iVar7 = (int)((ulong)((long)iVar6 - (long)iVar2) / (uVar10 - uVar15));
            }
            pMVar1 = pMVar11 + uVar15;
            Mat::create(pMVar1,iVar16,iVar7,uVar8,_elemsize,opt->blob_allocator);
            if (pMVar11[uVar15].data == (void *)0x0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar17) {
              if (0 < (int)uVar8) {
                uVar10 = 0;
                do {
                  memcpy((void *)(pMVar1->cstep * uVar10 * pMVar1->elemsize + (long)pMVar1->data),
                         (void *)((long)pMVar4->data +
                                 (long)pMVar4->w * (long)iVar2 * 4 +
                                 pMVar4->cstep * uVar10 * pMVar4->elemsize),
                         (long)(iVar7 * iVar16) * _elemsize);
                  uVar10 = uVar10 + 1;
                } while (uVar8 != uVar10);
              }
              iVar2 = iVar2 + iVar7;
            }
            if (bVar17) break;
            uVar15 = uVar15 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     0x6db6db6db6db6db7;
            if (uVar10 <= uVar15) {
              return 0;
            }
          }
        }
        else {
          if (uVar8 != 0 || uVar3 != 2) {
            return 0;
          }
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar2 = pMVar4->w;
          uVar8 = pMVar4->h;
          uVar3 = pMVar4->c;
          uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
          uVar15 = 0;
          iVar16 = 0;
          while( true ) {
            iVar6 = *(int *)((long)pvVar5 + uVar15 * 4);
            if (iVar6 == -0xe9) {
              iVar6 = (int)((ulong)((long)iVar2 - (long)iVar16) / (uVar10 - uVar15));
            }
            pMVar1 = pMVar11 + uVar15;
            Mat::create(pMVar1,iVar6,uVar8,uVar3,_elemsize,opt->blob_allocator);
            if (pMVar11[uVar15].data == (void *)0x0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar17) {
              if (0 < (int)uVar3) {
                local_a8 = 0;
                do {
                  if (0 < (int)uVar8) {
                    iVar7 = pMVar4->w;
                    __src = (void *)((long)pMVar4->data +
                                    pMVar4->cstep * pMVar4->elemsize * local_a8 + (long)iVar16 * 4);
                    pvVar13 = (void *)(pMVar1->cstep * pMVar1->elemsize * local_a8 +
                                      (long)pMVar1->data);
                    uVar10 = (ulong)uVar8;
                    do {
                      memcpy(pvVar13,__src,_elemsize * (long)iVar6);
                      __src = (void *)((long)__src + (long)iVar7 * 4);
                      pvVar13 = (void *)((long)pvVar13 + (long)iVar6 * 4);
                      uVar10 = uVar10 - 1;
                    } while (uVar10 != 0);
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 != uVar3);
              }
              iVar16 = iVar16 + iVar6;
            }
            if (bVar17) break;
            uVar15 = uVar15 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     0x6db6db6db6db6db7;
            if (uVar10 <= uVar15) {
              return 0;
            }
          }
        }
        return -100;
      }
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar2 = pMVar4->w;
        iVar16 = pMVar4->h;
        uVar10 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
        iVar6 = 0;
        uVar15 = 0;
        do {
          iVar7 = *(int *)((long)pvVar5 + uVar15 * 4);
          if (iVar7 == -0xe9) {
            iVar7 = (int)((ulong)((long)iVar2 - (long)iVar6) / (uVar10 - uVar15));
          }
          pMVar1 = pMVar11 + uVar15;
          Mat::create(pMVar1,iVar7,iVar16,_elemsize,opt->blob_allocator);
          if (pMVar11[uVar15].data == (void *)0x0) {
            bVar17 = true;
          }
          else {
            bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
          }
          if (!bVar17) {
            if (0 < iVar16) {
              iVar12 = 0;
              do {
                memcpy((void *)((long)pMVar1->w * (long)iVar12 * 4 + (long)pMVar1->data),
                       (void *)((long)pMVar4->data +
                               (long)iVar6 * 4 + (long)pMVar4->w * (long)iVar12 * 4),
                       (long)iVar7 * _elemsize);
                iVar12 = iVar12 + 1;
              } while (iVar16 != iVar12);
            }
            iVar6 = iVar6 + iVar7;
          }
          if (bVar17) {
            return -100;
          }
          uVar15 = uVar15 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   0x6db6db6db6db6db7;
        } while (uVar15 < uVar10);
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const float* ptr = bottom_blob.row(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                float* outptr = top_blob.row(j);
                const float* ptr = bottom_blob.row(j) + q;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = bottom_blob.cstep * slice;

            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                float* outptr = top_blob.channel(p);
                const float* ptr = bottom_blob.channel(p).row(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                float* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const float* ptr = m.row(j) + q;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}